

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<direct_solvers_lower_upper_factorisation_death_test_Test>::
CreateTest(TestFactoryImpl<direct_solvers_lower_upper_factorisation_death_test_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<direct_solvers_lower_upper_factorisation_death_test_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x90);
  direct_solvers_lower_upper_factorisation_death_test_Test::
  direct_solvers_lower_upper_factorisation_death_test_Test
            ((direct_solvers_lower_upper_factorisation_death_test_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }